

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

bool __thiscall S2Cap::MayIntersect(S2Cap *this,S2Cell *cell)

{
  bool bVar1;
  long lVar2;
  Vector3<double> *local_b0;
  S2Point local_a8;
  int local_8c;
  undefined1 local_88 [4];
  int k;
  S2Point vertices [4];
  S2Cell *cell_local;
  S2Cap *this_local;
  
  local_b0 = (Vector3<double> *)local_88;
  do {
    Vector3<double>::Vector3(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (Vector3<double> *)(vertices[3].c_ + 2));
  local_8c = 0;
  while( true ) {
    if (3 < local_8c) {
      bVar1 = Intersects(this,cell,(S2Point *)local_88);
      return bVar1;
    }
    S2Cell::GetVertex(&local_a8,cell,local_8c);
    lVar2 = (long)local_8c;
    *(VType *)(local_88 + lVar2 * 0x18) = local_a8.c_[0];
    vertices[lVar2].c_[0] = local_a8.c_[1];
    vertices[lVar2].c_[1] = local_a8.c_[2];
    bVar1 = Contains(this,(S2Point *)(local_88 + (long)local_8c * 0x18));
    if (bVar1) break;
    local_8c = local_8c + 1;
  }
  return true;
}

Assistant:

bool S2Cap::MayIntersect(const S2Cell& cell) const {
  // If the cap contains any cell vertex, return true.
  S2Point vertices[4];
  for (int k = 0; k < 4; ++k) {
    vertices[k] = cell.GetVertex(k);
    if (Contains(vertices[k])) return true;
  }
  return Intersects(cell, vertices);
}